

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_fog_vol.cxx
# Opt level: O2

void __thiscall read_fog_vol::operator()(read_fog_vol *this,fog_vol_data **_fog_vol,xr_reader *r)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  fog_vol_data *value;
  _matrix<float> *values;
  ulong n;
  
  value = (fog_vol_data *)operator_new(0x70);
  (value->ltx)._M_dataplus._M_p = (pointer)&(value->ltx).field_2;
  (value->ltx)._M_string_length = 0;
  (value->ltx).field_2._M_local_buf[0] = '\0';
  value->particles = (fmatrix *)0x0;
  *_fog_vol = value;
  xray_re::xr_reader::r_s(r,(string *)value);
  puVar1 = (r->field_2).m_p;
  uVar2 = *(undefined8 *)puVar1;
  uVar3 = *(undefined8 *)(puVar1 + 8);
  uVar4 = *(undefined8 *)(puVar1 + 0x10);
  uVar5 = *(undefined8 *)(puVar1 + 0x18);
  uVar6 = *(undefined8 *)(puVar1 + 0x20);
  uVar7 = *(undefined8 *)(puVar1 + 0x28);
  uVar8 = *(undefined8 *)(puVar1 + 0x38);
  *(undefined8 *)((long)&(value->xform).field_0 + 0x30) = *(undefined8 *)(puVar1 + 0x30);
  *(undefined8 *)((long)&(value->xform).field_0 + 0x38) = uVar8;
  *(undefined8 *)((long)&(value->xform).field_0 + 0x20) = uVar6;
  *(undefined8 *)((long)&(value->xform).field_0 + 0x28) = uVar7;
  *(undefined8 *)((long)&(value->xform).field_0 + 0x10) = uVar4;
  *(undefined8 *)((long)&(value->xform).field_0 + 0x18) = uVar5;
  *(undefined8 *)&(value->xform).field_0 = uVar2;
  *(undefined8 *)((long)&(value->xform).field_0 + 8) = uVar3;
  (r->field_2).m_p = puVar1 + 0x44;
  n = (ulong)*(uint *)(puVar1 + 0x40);
  value->num_particles = *(uint *)(puVar1 + 0x40);
  if (n != 0) {
    values = (_matrix<float> *)operator_new__(n << 6);
    value->particles = values;
    xray_re::xr_reader::r_cseq<xray_re::_matrix<float>>(r,n,values);
    return;
  }
  return;
}

Assistant:

void operator()(fog_vol_data*& _fog_vol, xr_reader& r) const {
	fog_vol_data* fog_vol = new fog_vol_data;
	_fog_vol = fog_vol;
	r.r_s(fog_vol->ltx);
	r.r(fog_vol->xform);
	if ((fog_vol->num_particles = r.r_u32())) {
		fog_vol->particles = new fmatrix[fog_vol->num_particles];
		r.r_cseq(fog_vol->num_particles, fog_vol->particles);
	}
}